

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_sub1(void)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  string str;
  thread thd1;
  bool stop;
  bool r;
  rpc_client client;
  undefined8 in_stack_fffffffffffffaa8;
  undefined1 enable;
  string *this;
  rpc_client *in_stack_fffffffffffffab0;
  allocator *paVar4;
  undefined7 in_stack_fffffffffffffad8;
  rpc_client *this_00;
  string local_510 [32];
  rpc_client *local_4f0;
  undefined1 *local_4e8;
  undefined1 local_4d3 [2];
  allocator local_4d1;
  string local_4d0 [39];
  allocator local_4a9;
  string local_4a8 [24];
  rpc_client *in_stack_fffffffffffffb70;
  allocator local_481;
  string local_480 [39];
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [32];
  uint local_410;
  undefined1 local_409 [36];
  byte local_3e5;
  rpc_client local_3d8;
  
  enable = (undefined1)((ulong)in_stack_fffffffffffffaa8 >> 0x38);
  rest_rpc::rpc_client::rpc_client(in_stack_fffffffffffffb70);
  rest_rpc::rpc_client::enable_auto_reconnect(in_stack_fffffffffffffab0,(bool)enable);
  rest_rpc::rpc_client::enable_auto_heartbeat(in_stack_fffffffffffffab0,(bool)enable);
  this_00 = (rpc_client *)local_409;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_409 + 1),"127.0.0.1",(allocator *)this_00);
  iVar2 = rest_rpc::rpc_client::connect(&local_3d8,(int)local_409 + 1,(sockaddr *)0x2328,0);
  bVar1 = (byte)iVar2;
  std::__cxx11::string::~string((string *)(local_409 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_409);
  local_3e5 = bVar1 & 1;
  bVar3 = local_3e5 != 0;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_430,"key",&local_431);
    rest_rpc::rpc_client::subscribe<test_sub1()::__0>(&local_3d8,local_430);
    std::__cxx11::string::~string(local_430);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_458,"key",&local_459);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_480,"048a796c8a3c6a6b7bd1223bf2c8cee05232e927b521984ba417cb2fca6df9d1",
               &local_481);
    rest_rpc::rpc_client::subscribe<test_sub1()::__1>(&local_3d8,local_458,local_480);
    std::__cxx11::string::~string(local_480);
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
    std::__cxx11::string::~string(local_458);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a8,"key1",&local_4a9);
    paVar4 = &local_4d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_4d0,"048a796c8a3c6a6b7bd1223bf2c8cee05232e927b521984ba417cb2fca6df9d1",paVar4);
    rest_rpc::rpc_client::subscribe<test_sub1()::__2>(&local_3d8,local_4a8,local_4d0);
    std::__cxx11::string::~string(local_4d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
    std::__cxx11::string::~string(local_4a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
    local_4d3[0] = 0;
    local_4f0 = &local_3d8;
    local_4e8 = local_4d3;
    std::thread::thread<test_sub1()::__3,,void>
              ((thread *)this_00,(type *)CONCAT17(bVar1,in_stack_fffffffffffffad8));
    this = local_510;
    std::__cxx11::string::string(this);
    std::operator>>((istream *)&std::cin,this);
    std::__cxx11::string::~string(local_510);
    std::thread::~thread((thread *)0x1b0135);
  }
  local_410 = (uint)!bVar3;
  rest_rpc::rpc_client::~rpc_client(this_00);
  return;
}

Assistant:

void test_sub1() {
  rpc_client client;
  client.enable_auto_reconnect();
  client.enable_auto_heartbeat();
  bool r = client.connect("127.0.0.1", 9000);
  if (!r) {
    return;
  }

  client.subscribe("key", [](string_view data) { std::cout << data << "\n"; });

  client.subscribe(
      "key", "048a796c8a3c6a6b7bd1223bf2c8cee05232e927b521984ba417cb2fca6df9d1",
      [](string_view data) {
        msgpack_codec codec;
        person p = codec.unpack<person>(data.data(), data.size());
        std::cout << p.name << "\n";
      });

  client.subscribe(
      "key1",
      "048a796c8a3c6a6b7bd1223bf2c8cee05232e927b521984ba417cb2fca6df9d1",
      [](string_view data) { std::cout << data << "\n"; });

  bool stop = false;
  std::thread thd1([&client, &stop] {
    while (true) {
      try {
        if (client.has_connected()) {
          int r = client.call<int>("add", 2, 3);
          std::cout << "add result: " << r << "\n";
        }

        std::this_thread::sleep_for(std::chrono::milliseconds(1));
      } catch (const std::exception &ex) {
        std::cout << ex.what() << "\n";
      }
    }
  });

  /*rpc_client client1;
  bool r1 = client1.connect("127.0.0.1", 9000);
  if (!r1) {
          return;
  }

  person p{10, "jack", 21};
  client1.publish("key", "hello subscriber");
  client1.publish_by_token("key", "sub_key", p);

  std::thread thd([&client1, p] {
          while (true) {
                  try {
                          client1.publish("key", "hello subscriber");
                          client1.publish_by_token("key", "unique_token", p);
                  }
                  catch (const std::exception& ex) {
                          std::cout << ex.what() << "\n";
                  }
          }
  });
*/

  std::string str;
  std::cin >> str;
}